

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffghps(fitsfile *fptr,int *nexist,int *position,int *status)

{
  FITSfile *pFVar1;
  undefined1 auVar2 [16];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (nexist != (int *)0x0) {
    pFVar1 = fptr->Fptr;
    auVar2 = SEXT816(pFVar1->headend - pFVar1->headstart[pFVar1->curhdu]) *
             SEXT816(0x6666666666666667);
    *nexist = (int)(auVar2._8_8_ >> 5) - (auVar2._12_4_ >> 0x1f);
  }
  if (position != (int *)0x0) {
    pFVar1 = fptr->Fptr;
    auVar2 = SEXT816(pFVar1->nextkey - pFVar1->headstart[pFVar1->curhdu]) *
             SEXT816(0x6666666666666667);
    *position = ((int)(auVar2._8_8_ >> 5) - (auVar2._12_4_ >> 0x1f)) + 1;
  }
  return *status;
}

Assistant:

int ffghps(fitsfile *fptr, /* I - FITS file pointer                     */
          int *nexist,     /* O - number of existing keywords in header */
          int *position,   /* O - position of next keyword to be read   */
          int *status)     /* IO - error status                         */
/*
  return the number of existing keywords and the position of the next
  keyword that will be read.
*/
{
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (nexist)
      *nexist = (int) (( ((fptr->Fptr)->headend) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu]) ) / 80);

    if (position)
      *position = (int) (( ((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu]) ) / 80 + 1);

    return(*status);
}